

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_frame_codec.c
# Opt level: O0

void frame_received(void *context,uchar *type_specific,uint32_t type_specific_size,uchar *frame_body
                   ,uint32_t frame_body_size)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  bool bVar3;
  ulong local_68;
  ulong local_60;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  size_t size;
  SASL_FRAME_CODEC_INSTANCE *sasl_frame_codec_instance;
  uchar *puStack_28;
  uint32_t frame_body_size_local;
  uchar *frame_body_local;
  uint32_t type_specific_size_local;
  uchar *type_specific_local;
  void *context_local;
  
  if ((ulong)type_specific_size < -(ulong)frame_body_size - 1) {
    local_60 = (ulong)type_specific_size + (ulong)frame_body_size;
  }
  else {
    local_60 = 0xffffffffffffffff;
  }
  if (local_60 < 0xfffffffffffffff9) {
    local_68 = local_60 + 6;
  }
  else {
    local_68 = 0xffffffffffffffff;
  }
  if ((local_68 < 0x201) && (frame_body_size != 0)) {
    if (*(int *)((long)context + 0x28) == 0) {
      *(undefined8 *)((long)context + 0x30) = 0;
      sasl_frame_codec_instance._4_4_ = frame_body_size;
      puStack_28 = frame_body;
      while( true ) {
        bVar3 = false;
        if ((sasl_frame_codec_instance._4_4_ != 0) &&
           (bVar3 = false, *(long *)((long)context + 0x30) == 0)) {
          bVar3 = *(int *)((long)context + 0x28) != 1;
        }
        if (!bVar3) break;
        iVar1 = amqpvalue_decode_bytes
                          (*(AMQPVALUE_DECODER_HANDLE *)((long)context + 0x20),puStack_28,1);
        if (iVar1 == 0) {
          sasl_frame_codec_instance._4_4_ = sasl_frame_codec_instance._4_4_ - 1;
          puStack_28 = puStack_28 + 1;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                      ,"frame_received",0x76,1,"Could not decode SASL frame AMQP value");
          }
          *(undefined4 *)((long)context + 0x28) = 1;
        }
      }
      if (sasl_frame_codec_instance._4_4_ != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                    ,"frame_received",0x83,1,"More than one AMQP value detected in SASL frame");
        }
        *(undefined4 *)((long)context + 0x28) = 1;
        (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18));
      }
      if (*(int *)((long)context + 0x28) != 1) {
        (**(code **)((long)context + 8))
                  (*(undefined8 *)((long)context + 0x18),*(undefined8 *)((long)context + 0x30));
      }
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                ,"frame_received",0x5d,1,"Bad SASL frame size");
    }
    (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18));
  }
  return;
}

Assistant:

static void frame_received(void* context, const unsigned char* type_specific, uint32_t type_specific_size, const unsigned char* frame_body, uint32_t frame_body_size)
{
    SASL_FRAME_CODEC_INSTANCE* sasl_frame_codec_instance = (SASL_FRAME_CODEC_INSTANCE*)context;

    /* Codes_SRS_SASL_FRAME_CODEC_01_006: [Bytes 6 and 7 of the header are ignored.] */
    (void)type_specific;
    /* Codes_SRS_SASL_FRAME_CODEC_01_007: [The extended header is ignored.] */

    /* Codes_SRS_SASL_FRAME_CODEC_01_008: [The maximum size of a SASL frame is defined by MIN-MAX-FRAME-SIZE.] */
    size_t size = safe_add_size_t(type_specific_size, frame_body_size);
    size = safe_add_size_t(size, 6);
    if ((size > MIX_MAX_FRAME_SIZE) ||
        /* Codes_SRS_SASL_FRAME_CODEC_01_010: [Receipt of an empty frame is an irrecoverable error.] */
        (frame_body_size == 0))
    {
        LogError("Bad SASL frame size");

        /* Codes_SRS_SASL_FRAME_CODEC_01_049: [If any error occurs while decoding a frame, the decoder shall call the on_sasl_frame_codec_error and pass to it the callback_context, both of those being the ones given to sasl_frame_codec_create.] */
        sasl_frame_codec_instance->on_sasl_frame_codec_error(sasl_frame_codec_instance->callback_context);
    }
    else
    {
        switch (sasl_frame_codec_instance->decode_state)
        {
        default:
        case SASL_FRAME_DECODE_ERROR:
            break;

        case SASL_FRAME_DECODE_FRAME:
            sasl_frame_codec_instance->decoded_sasl_frame_value = NULL;

            /* Codes_SRS_SASL_FRAME_CODEC_01_039: [sasl_frame_codec shall decode the sasl-frame value as a described type.] */
            /* Codes_SRS_SASL_FRAME_CODEC_01_048: [Receipt of an empty frame is an irrecoverable error.] */
            while ((frame_body_size > 0) &&
                (sasl_frame_codec_instance->decoded_sasl_frame_value == NULL) &&
                (sasl_frame_codec_instance->decode_state != SASL_FRAME_DECODE_ERROR))
            {
                /* Codes_SRS_SASL_FRAME_CODEC_01_040: [Decoding the sasl-frame type shall be done by feeding the bytes to the decoder create in sasl_frame_codec_create.] */
                if (amqpvalue_decode_bytes(sasl_frame_codec_instance->decoder, frame_body, 1) != 0)
                {
                    LogError("Could not decode SASL frame AMQP value");
                    sasl_frame_codec_instance->decode_state = SASL_FRAME_DECODE_ERROR;
                }
                else
                {
                    frame_body_size--;
                    frame_body++;
                }
            }

            /* Codes_SRS_SASL_FRAME_CODEC_01_009: [The frame body of a SASL frame MUST contain exactly one AMQP type, whose type encoding MUST have provides="sasl-frame".] */
            if (frame_body_size > 0)
            {
                LogError("More than one AMQP value detected in SASL frame");
                sasl_frame_codec_instance->decode_state = SASL_FRAME_DECODE_ERROR;

                /* Codes_SRS_SASL_FRAME_CODEC_01_049: [If any error occurs while decoding a frame, the decoder shall call the on_sasl_frame_codec_error and pass to it the callback_context, both of those being the ones given to sasl_frame_codec_create.] */
                sasl_frame_codec_instance->on_sasl_frame_codec_error(sasl_frame_codec_instance->callback_context);
            }

            if (sasl_frame_codec_instance->decode_state != SASL_FRAME_DECODE_ERROR)
            {
                /* Codes_SRS_SASL_FRAME_CODEC_01_041: [Once the sasl frame is decoded, the callback on_sasl_frame_received shall be called.] */
                /* Codes_SRS_SASL_FRAME_CODEC_01_042: [The decoded sasl-frame value and the context passed in sasl_frame_codec_create shall be passed to on_sasl_frame_received.] */
                sasl_frame_codec_instance->on_sasl_frame_received(sasl_frame_codec_instance->callback_context, sasl_frame_codec_instance->decoded_sasl_frame_value);
            }
            break;
        }
    }
}